

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::consumeLineBreakIfPresent(Scanner *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = this->Current;
  if (this->End == pcVar1) {
    return false;
  }
  if (*pcVar1 == '\n') {
    pcVar2 = pcVar1 + 1;
  }
  else {
    if (*pcVar1 != '\r') {
      return false;
    }
    pcVar2 = pcVar1 + 1;
    if ((pcVar2 != this->End) && (pcVar1[1] == '\n')) {
      pcVar2 = pcVar1 + 2;
    }
  }
  this->Column = 0;
  this->Line = this->Line + 1;
  this->Current = pcVar2;
  return true;
}

Assistant:

bool Scanner::consumeLineBreakIfPresent() {
  auto Next = skip_b_break(Current);
  if (Next == Current)
    return false;
  Column = 0;
  ++Line;
  Current = Next;
  return true;
}